

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ScoreList *this;
  Score *pSVar2;
  Score *pSVar3;
  Score *this_00;
  Score *this_01;
  ScoreIterator *pSVar4;
  undefined4 extraout_var;
  ostream *poVar6;
  int i;
  allocator<char> local_59;
  string local_58;
  Score *local_38;
  long lVar5;
  
  this = (ScoreList *)operator_new(0x110);
  ScoreList::ScoreList(this);
  pSVar2 = (Score *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"s1",&local_59);
  Score::Score(pSVar2,&local_58,10);
  std::__cxx11::string::~string((string *)&local_58);
  pSVar3 = (Score *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"s2",&local_59);
  Score::Score(pSVar3,&local_58,0xf);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (Score *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"s3",&local_59);
  local_38 = pSVar3;
  Score::Score(this_00,&local_58,9);
  std::__cxx11::string::~string((string *)&local_58);
  pSVar3 = (Score *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"s4",&local_59);
  Score::Score(pSVar3,&local_58,0);
  std::__cxx11::string::~string((string *)&local_58);
  this_01 = (Score *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"s5",&local_59);
  Score::Score(this_01,&local_58,0x13);
  std::__cxx11::string::~string((string *)&local_58);
  ScoreList::append(this,pSVar2);
  ScoreList::append(this,local_38);
  ScoreList::append(this,this_00);
  ScoreList::append(this,pSVar3);
  ScoreList::append(this,this_01);
  pSVar4 = ScoreList::iterator(this);
  (*(pSVar4->super_Iterator)._vptr_Iterator[2])(pSVar4);
  do {
    iVar1 = (*(pSVar4->super_Iterator)._vptr_Iterator[5])(pSVar4);
    lVar5 = CONCAT44(extraout_var,iVar1);
    if (lVar5 != 0) {
      std::__cxx11::string::string((string *)&local_58,(string *)(lVar5 + 8));
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_58);
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)(lVar5 + 0x28));
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&local_58);
    }
    iVar1 = (*(pSVar4->super_Iterator)._vptr_Iterator[4])(pSVar4);
  } while ((char)iVar1 != '\0');
  for (iVar1 = 0; iVar1 < this->_count; iVar1 = iVar1 + 1) {
    pSVar2 = ScoreList::get(this,iVar1);
    if (pSVar2 != (Score *)0x0) {
      pSVar2 = ScoreList::get(this,iVar1);
      if (pSVar2 != (Score *)0x0) {
        (*pSVar2->_vptr_Score[1])(pSVar2);
      }
    }
  }
  (*this->_vptr_ScoreList[1])(this);
  (*(pSVar4->super_Iterator)._vptr_Iterator[1])(pSVar4);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	ScoreList* list = new ScoreList();

	Score* s1 = new Score("s1", 10);
	Score* s2 = new Score("s2", 15);
	Score* s3 = new Score("s3", 9);
	Score* s4 = new Score("s4", 0);
	Score* s5 = new Score("s5", 19);

	list->append(s1);
	list->append(s2);
	list->append(s3);
	list->append(s4);
	list->append(s5);

	ScoreIterator* it= list->iterator();

	it->first();
	do {
		Score* s = it->current();
		if (!s)
			continue;

		cout<<s->getName()<<":"<<s->getScore()<<endl;

	} while (it->next());

	for (int i = 0; i < list->count(); ++i) {
		if (list->get(i))
			delete list->get(i);
	}
	delete list;
	delete it;

	return 0;
}